

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::PCVScanner::create(PCVScanner *this)

{
  PCVFunctionStructValuesMap *functionNewInfos;
  PCVFunctionStructValuesMap *functionSetInfos;
  BoolFunctionStructValuesMap *functionCopyInfos;
  PCVScanner *this_00;
  long in_RSI;
  
  functionNewInfos = *(PCVFunctionStructValuesMap **)(in_RSI + 0x130);
  functionSetInfos = *(PCVFunctionStructValuesMap **)(in_RSI + 0x138);
  functionCopyInfos = *(BoolFunctionStructValuesMap **)(in_RSI + 0x140);
  this_00 = (PCVScanner *)operator_new(0x148);
  PCVScanner(this_00,functionNewInfos,functionSetInfos,functionCopyInfos);
  (this->super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>)
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<PCVScanner>(
      functionNewInfos, functionSetGetInfos, functionCopyInfos);
  }